

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexDump.h
# Opt level: O2

void __thiscall arangodb::velocypack::HexDump::~HexDump(HexDump *this)

{
  std::__cxx11::string::~string((string *)&this->header);
  std::__cxx11::string::~string((string *)&this->separator);
  return;
}

Assistant:

HexDump(Slice slice, int valuesPerLine = 16,
          std::string const& separator = " ", std::string const& header = "0x")
      : data(slice.start()),
        length(slice.byteSize()),
        valuesPerLine(valuesPerLine),
        separator(separator),
        header(header) {}